

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sight.cpp
# Opt level: O0

bool __thiscall SightCheck::P_SightCheckLine(SightCheck *this,line_t_conflict *ld)

{
  int iVar1;
  int iVar2;
  undefined1 local_78 [8];
  intercept_t newintercept;
  DVector2 local_50;
  undefined1 local_40 [8];
  divline_t dl;
  line_t_conflict *ld_local;
  SightCheck *this_local;
  
  if (ld->validcount == validcount) {
    this_local._7_1_ = true;
  }
  else {
    ld->validcount = validcount;
    dl.dy = (double)ld;
    vertex_t::fPos((vertex_t *)&local_50);
    iVar1 = P_PointOnDivlineSide(&local_50,&this->Trace);
    vertex_t::fPos((vertex_t *)&newintercept.d);
    iVar2 = P_PointOnDivlineSide((DVector2 *)&newintercept.d,&this->Trace);
    if (iVar1 == iVar2) {
      this_local._7_1_ = true;
    }
    else {
      P_MakeDivline((line_t *)dl.dy,(divline_t *)local_40);
      iVar1 = P_PointOnDivlineSide((this->Trace).x,(this->Trace).y,(divline_t *)local_40);
      iVar2 = P_PointOnDivlineSide
                        ((this->Trace).x + (this->Trace).dx,(this->Trace).y + (this->Trace).dy,
                         (divline_t *)local_40);
      if (iVar1 == iVar2) {
        this_local._7_1_ = true;
      }
      else if (((*(long *)((long)dl.dy + 0x80) == 0) || ((*(uint *)((long)dl.dy + 0x20) & 4) == 0))
              || ((*(uint *)((long)dl.dy + 0x20) & 0x4000000) != 0)) {
        this_local._7_1_ = false;
      }
      else {
        if ((*(uint *)((long)dl.dy + 0x20) & 0x8000) != 0) {
          if ((this->Flags & 4U) == 0) {
            return false;
          }
          if ((this->Flags & 2U) == 0) {
            if ((*(uint *)((long)dl.dy + 0x24) & 8) == 0) {
              return false;
            }
            if ((*(int *)((long)dl.dy + 0x28) != 0x50) && (*(int *)((long)dl.dy + 0x28) != 0xe2)) {
              return false;
            }
            if ((*(int *)((long)dl.dy + 0x30) != 0) &&
               (*(int *)((long)dl.dy + 0x30) != ::level.levelnum)) {
              return false;
            }
          }
        }
        sightcounts[3] = sightcounts[3] + 1;
        newintercept.frac._0_1_ = 1;
        newintercept._8_8_ = dl.dy;
        TArray<intercept_t,_intercept_t>::Push(&intercepts,(intercept_t *)local_78);
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool SightCheck::P_SightCheckLine (line_t *ld)
{
	divline_t dl;

	if (ld->validcount == validcount)
	{
		return true;
	}
	ld->validcount = validcount;
	if (P_PointOnDivlineSide (ld->v1->fPos(), &Trace) ==
		P_PointOnDivlineSide (ld->v2->fPos(), &Trace))
	{
		return true;		// line isn't crossed
	}
	P_MakeDivline (ld, &dl);
	if (P_PointOnDivlineSide (Trace.x, Trace.y, &dl) ==
		P_PointOnDivlineSide (Trace.x+Trace.dx, Trace.y+Trace.dy, &dl))
	{
		return true;		// line isn't crossed
	}

	// try to early out the check
	if (!ld->backsector || !(ld->flags & ML_TWOSIDED) || (ld->flags & ML_BLOCKSIGHT))
		return false;	// stop checking

	// [RH] don't see past block everything lines
	if (ld->flags & ML_BLOCKEVERYTHING)
	{
		if (!(Flags & SF_SEEPASTBLOCKEVERYTHING))
		{
			return false;
		}
		// Pretend the other side is invisible if this is not an impact line
		// that runs a script on the current map. Used to prevent monsters
		// from trying to attack through a block everything line unless
		// there's a chance their attack will make it nonblocking.
		if (!(Flags & SF_SEEPASTSHOOTABLELINES))
		{
			if (!(ld->activation & SPAC_Impact))
			{
				return false;
			}
			if (ld->special != ACS_Execute && ld->special != ACS_ExecuteAlways)
			{
				return false;
			}
			if (ld->args[1] != 0 && ld->args[1] != level.levelnum)
			{
				return false;
			}
		}
	}

	sightcounts[3]++;
	// store the line for later intersection testing
	intercept_t newintercept;
	newintercept.isaline = true;
	newintercept.d.line = ld;
	intercepts.Push (newintercept);

	return true;
}